

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getInputMatrix(FastText *this)

{
  runtime_error *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<fasttext::Matrix> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_fasttext::DenseMatrix> sVar2;
  shared_ptr<fasttext::DenseMatrix> *in_stack_ffffffffffffffa8;
  shared_ptr<const_fasttext::DenseMatrix> *in_stack_ffffffffffffffb0;
  
  if (((ulong)in_RSI[6].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::get
                     (&in_RSI[2].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar1 != (element_type *)0x0) {
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>(in_RSI);
    std::shared_ptr<fasttext::DenseMatrix_const>::shared_ptr<fasttext::DenseMatrix,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x1b8331);
    sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (shared_ptr<const_fasttext::DenseMatrix>)
           sVar2.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("input_.get()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                ,0x45,
                "std::shared_ptr<const DenseMatrix> fasttext::FastText::getInputMatrix() const");
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getInputMatrix() const {
  if (quant_) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(input_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(input_);
}